

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O2

void Godunov::ComputeAdvectiveVel
               (Box *xbx,Box *ybx,Box *zbx,Array4<double> *u_ad,Array4<double> *v_ad,
               Array4<double> *w_ad,Array4<const_double> *Imx,Array4<const_double> *Imy,
               Array4<const_double> *Imz,Array4<const_double> *Ipx,Array4<const_double> *Ipy,
               Array4<const_double> *Ipz,Array4<const_double> *vel,Array4<const_double> *f,
               Box *domain,Real l_dt,BCRec *pbc,bool l_use_forces_in_trans)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  double *pdVar60;
  long lVar61;
  double *pdVar62;
  double *pdVar63;
  long lVar64;
  double *pdVar65;
  double *pdVar66;
  double *pdVar67;
  double *pdVar68;
  double *pdVar69;
  double *pdVar70;
  long lVar71;
  double *pdVar72;
  long lVar73;
  double *pdVar74;
  double *pdVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  double *pdVar80;
  long lVar81;
  int j_1;
  long lVar82;
  long lVar83;
  double *pdVar84;
  long lVar85;
  double *pdVar86;
  ulong uVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double *local_2a8;
  double *local_268;
  
  lVar61 = u_ad->jstride;
  lVar71 = u_ad->kstride;
  lVar83 = (long)(xbx->smallend).vect[1];
  lVar78 = (long)(xbx->smallend).vect[2];
  iVar1 = (xbx->smallend).vect[0];
  lVar79 = (long)iVar1;
  pdVar63 = u_ad->p + ((lVar79 + (lVar78 - (u_ad->begin).z) * lVar71 +
                                 (lVar83 - (u_ad->begin).y) * lVar61) - (long)(u_ad->begin).x);
  lVar76 = Imx->kstride;
  lVar81 = Imx->jstride;
  pdVar67 = Imx->p + ((lVar79 + (lVar78 - (Imx->begin).z) * lVar76 +
                                (lVar83 - (Imx->begin).y) * lVar81) - (long)(Imx->begin).x);
  lVar64 = (long)(f->begin).z;
  lVar32 = f->kstride;
  lVar73 = (long)(f->begin).y;
  lVar33 = f->jstride;
  lVar85 = Ipx->kstride;
  lVar58 = Ipx->jstride;
  pdVar65 = Ipx->p + ((lVar79 + (lVar78 - (Ipx->begin).z) * lVar85 +
                                (lVar83 - (Ipx->begin).y) * lVar58 + -1) - (long)(Ipx->begin).x);
  iVar2 = (domain->smallend).vect[0];
  iVar3 = (domain->smallend).vect[1];
  iVar4 = (domain->smallend).vect[2];
  iVar5 = (domain->bigend).vect[0];
  iVar6 = (domain->bigend).vect[1];
  iVar7 = (domain->bigend).vect[2];
  pdVar62 = Ipy->p;
  lVar34 = Ipy->jstride;
  lVar35 = Ipy->kstride;
  lVar36 = Ipy->nstride;
  iVar8 = (Ipy->begin).x;
  iVar9 = (Ipy->begin).y;
  iVar10 = (Ipy->begin).z;
  pdVar70 = Imy->p;
  lVar37 = Imy->jstride;
  lVar38 = Imy->kstride;
  lVar39 = Imy->nstride;
  iVar11 = (Imy->begin).x;
  iVar12 = (Imy->begin).y;
  iVar13 = (Imy->begin).z;
  pdVar69 = f->p;
  lVar82 = (long)(f->begin).x;
  lVar40 = f->nstride;
  pdVar41 = vel->p;
  lVar42 = vel->jstride;
  lVar43 = vel->kstride;
  uVar14 = (vel->begin).x;
  lVar77 = (long)(int)uVar14;
  uVar15 = (vel->begin).y;
  uVar16 = (vel->begin).z;
  lVar44 = vel->nstride;
  pdVar72 = v_ad->p;
  lVar45 = v_ad->jstride;
  lVar46 = v_ad->kstride;
  iVar17 = (v_ad->begin).x;
  iVar18 = (v_ad->begin).y;
  iVar19 = (v_ad->begin).z;
  pdVar66 = Ipz->p;
  lVar47 = Ipz->jstride;
  lVar48 = Ipz->kstride;
  lVar49 = Ipz->nstride;
  iVar20 = (Ipz->begin).x;
  iVar21 = (Ipz->begin).y;
  iVar22 = (Ipz->begin).z;
  pdVar84 = Imz->p;
  lVar50 = Imz->jstride;
  lVar51 = Imz->kstride;
  lVar52 = Imz->nstride;
  iVar23 = (Imz->begin).x;
  iVar24 = (Imz->begin).y;
  iVar25 = (Imz->begin).z;
  pdVar86 = w_ad->p;
  lVar53 = w_ad->jstride;
  lVar54 = w_ad->kstride;
  iVar26 = (w_ad->begin).x;
  iVar27 = (w_ad->begin).y;
  iVar28 = (w_ad->begin).z;
  iVar29 = (xbx->bigend).vect[0];
  iVar30 = (xbx->bigend).vect[1];
  iVar31 = (xbx->bigend).vect[2];
  dVar88 = l_dt * 0.5;
  pdVar74 = pdVar69 + ((lVar79 + (lVar78 - lVar64) * lVar32 + (lVar83 - lVar73) * lVar33 + -1) -
                      lVar82);
  for (; lVar78 <= iVar31; lVar78 = lVar78 + 1) {
    lVar59 = (lVar78 - (int)uVar16) * lVar43;
    pdVar60 = pdVar67;
    pdVar68 = pdVar65;
    pdVar75 = pdVar74;
    pdVar80 = pdVar63;
    for (lVar57 = lVar83; lVar57 <= iVar30; lVar57 = lVar57 + 1) {
      if (iVar1 <= iVar29) {
        lVar55 = (lVar57 - (int)uVar15) * lVar42;
        lVar56 = 0;
        do {
          dVar89 = pdVar68[lVar56];
          dVar90 = pdVar60[lVar56];
          if (l_use_forces_in_trans) {
            dVar89 = dVar89 + pdVar75[lVar56] * dVar88;
            dVar90 = dVar90 + (pdVar75 + lVar56)[1] * dVar88;
          }
          if ((long)iVar2 < lVar79 + lVar56) {
            if ((long)iVar5 < lVar79 + lVar56) {
              switch(pbc->bc[3]) {
              case 0:
                break;
              case 1:
              case 2:
              case 4:
                dVar90 = dVar89;
                break;
              case 3:
                dVar89 = pdVar41[lVar55 + (int)((iVar5 - uVar14) + 1) + lVar59];
                dVar90 = dVar89;
                break;
              case -1:
                dVar90 = 0.0;
                dVar89 = 0.0;
                break;
              default:
                goto switchD_0037f8c7_default;
              }
            }
          }
          else {
            switch(pbc->bc[0]) {
            case 3:
              dVar90 = pdVar41[lVar55 + (int)(~uVar14 + iVar2) + lVar59];
            case 1:
            case 2:
            case 4:
              dVar89 = dVar90;
              dVar90 = dVar89;
              break;
            case -1:
              dVar90 = 0.0;
              dVar89 = 0.0;
            }
          }
switchD_0037f8c7_default:
          if (((dVar89 <= 0.0) && (0.0 <= dVar90)) || (ABS(dVar90 + dVar89) < 1e-08)) {
            dVar90 = 0.0;
          }
          else {
            uVar87 = -(ulong)(0.0 <= dVar90 + dVar89);
            dVar90 = (double)(~uVar87 & (ulong)dVar90 | (ulong)dVar89 & uVar87);
          }
          pdVar80[lVar56] = dVar90;
          lVar56 = lVar56 + 1;
        } while ((iVar29 - iVar1) + 1 != (int)lVar56);
      }
      pdVar80 = pdVar80 + lVar61;
      pdVar60 = pdVar60 + lVar81;
      pdVar75 = pdVar75 + lVar33;
      pdVar68 = pdVar68 + lVar58;
    }
    pdVar63 = pdVar63 + lVar71;
    pdVar67 = pdVar67 + lVar76;
    pdVar74 = pdVar74 + lVar32;
    pdVar65 = pdVar65 + lVar85;
  }
  lVar85 = (long)(ybx->smallend).vect[1];
  lVar81 = (long)(ybx->smallend).vect[2];
  lVar61 = (lVar81 - lVar64) * lVar32;
  lVar76 = (lVar81 - (int)uVar16) * lVar43;
  iVar1 = (ybx->smallend).vect[0];
  lVar71 = (long)iVar1;
  pdVar72 = pdVar72 + ((lVar71 + (lVar81 - iVar19) * lVar46 + (lVar85 - iVar18) * lVar45) -
                      (long)iVar17);
  iVar2 = (ybx->bigend).vect[0];
  pdVar70 = pdVar70 + ((lVar71 + lVar39 + (lVar81 - iVar13) * lVar38 + (lVar85 - iVar12) * lVar37) -
                      (long)iVar11);
  iVar5 = (ybx->bigend).vect[1];
  iVar11 = (ybx->bigend).vect[2];
  pdVar65 = pdVar69 + ((lVar71 + lVar40 + lVar61 + (lVar85 - lVar73) * lVar33) - lVar82);
  pdVar67 = pdVar69 + ((lVar71 + lVar40 + ((lVar85 + -1) - lVar73) * lVar33 + lVar61) - lVar82);
  local_2a8 = pdVar41 + ((lVar71 + lVar44 + lVar76 + (int)((iVar6 - uVar15) + 1) * lVar42) - lVar77)
  ;
  pdVar74 = pdVar41 + ((lVar71 + lVar44 + lVar76 + (int)(~uVar15 + iVar3) * lVar42) - lVar77);
  pdVar62 = pdVar62 + ((lVar71 + lVar36 + ((lVar85 - iVar9) + -1) * lVar34 +
                                          (lVar81 - iVar10) * lVar35) - (long)iVar8);
  do {
    pdVar63 = pdVar62;
    pdVar60 = pdVar65;
    pdVar68 = pdVar67;
    pdVar75 = pdVar70;
    lVar61 = lVar85;
    pdVar80 = pdVar72;
    if (iVar11 < lVar81) {
      lVar71 = (long)(zbx->smallend).vect[1];
      lVar61 = lVar33 * (lVar71 - lVar73);
      lVar76 = (long)(zbx->smallend).vect[2];
      iVar1 = (zbx->smallend).vect[0];
      lVar81 = (long)iVar1;
      pdVar72 = pdVar69 + ((lVar81 + lVar40 * 2 + (lVar76 - lVar64) * lVar32 + lVar61) - lVar82);
      pdVar69 = pdVar69 + ((lVar81 + lVar40 * 2 + ((lVar76 + -1) - lVar64) * lVar32 + lVar61) -
                          lVar82);
      lVar61 = (lVar71 - (int)uVar15) * lVar42;
      pdVar86 = pdVar86 + ((lVar81 + (lVar76 - iVar28) * lVar54 + (lVar71 - iVar27) * lVar53) -
                          (long)iVar26);
      pdVar84 = pdVar84 + ((lVar81 + lVar52 * 2 +
                                     (lVar76 - iVar25) * lVar51 + (lVar71 - iVar24) * lVar50) -
                          (long)iVar23);
      iVar2 = (zbx->bigend).vect[0];
      iVar3 = (zbx->bigend).vect[1];
      iVar5 = (zbx->bigend).vect[2];
      pdVar66 = pdVar66 + ((lVar81 + lVar49 * 2 +
                                     ((lVar76 - iVar22) + -1) * lVar48 + (lVar71 - iVar21) * lVar47)
                          - (long)iVar20);
      do {
        pdVar62 = pdVar66;
        pdVar70 = pdVar69;
        pdVar65 = pdVar72;
        pdVar67 = pdVar41 + ((lVar81 + lVar44 * 2 + lVar61 + (int)(~uVar16 + iVar4) * lVar43) -
                            lVar77);
        lVar85 = lVar71;
        pdVar74 = pdVar84;
        pdVar63 = pdVar86;
        local_268 = pdVar41 + ((lVar81 + lVar44 * 2 + lVar61 + (int)((iVar7 - uVar16) + 1) * lVar43)
                              - lVar77);
        if (iVar5 < lVar76) {
          return;
        }
        for (; lVar85 <= iVar3; lVar85 = lVar85 + 1) {
          if (iVar1 <= iVar2) {
            lVar58 = 0;
            do {
              dVar90 = pdVar62[lVar58];
              dVar89 = pdVar74[lVar58];
              if (l_use_forces_in_trans) {
                dVar90 = dVar90 + pdVar70[lVar58] * dVar88;
                dVar89 = dVar89 + pdVar65[lVar58] * dVar88;
              }
              if (iVar4 < lVar76) {
                if (iVar7 < lVar76) {
                  switch(pbc[2].bc[5]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar89 = dVar90;
                    break;
                  case 3:
                    dVar89 = local_268[lVar58];
                    goto switchD_003801ae_caseD_1;
                  case -1:
                    goto switchD_00380194_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[2].bc[2]) {
                case 3:
                  dVar89 = pdVar67[lVar58];
                case 1:
                case 2:
                case 4:
switchD_003801ae_caseD_1:
                  dVar90 = dVar89;
                  break;
                case -1:
switchD_00380194_caseD_ffffffff:
                  dVar89 = 0.0;
                  dVar90 = 0.0;
                }
              }
              if (((dVar90 <= 0.0) && (0.0 <= dVar89)) || (ABS(dVar89 + dVar90) < 1e-08)) {
                dVar90 = 0.0;
              }
              else {
                uVar87 = -(ulong)(0.0 <= dVar89 + dVar90);
                dVar90 = (double)(~uVar87 & (ulong)dVar89 | (ulong)dVar90 & uVar87);
              }
              pdVar63[lVar58] = dVar90;
              lVar58 = lVar58 + 1;
            } while ((iVar2 - iVar1) + 1 != (int)lVar58);
          }
          pdVar62 = pdVar62 + lVar47;
          pdVar70 = pdVar70 + lVar33;
          pdVar65 = pdVar65 + lVar33;
          pdVar67 = pdVar67 + lVar42;
          pdVar74 = pdVar74 + lVar50;
          pdVar63 = pdVar63 + lVar53;
          local_268 = local_268 + lVar42;
        }
        lVar76 = lVar76 + 1;
        pdVar72 = pdVar72 + lVar32;
        pdVar69 = pdVar69 + lVar32;
        pdVar86 = pdVar86 + lVar54;
        pdVar84 = pdVar84 + lVar51;
        pdVar66 = pdVar66 + lVar48;
      } while( true );
    }
    for (; lVar61 <= iVar5; lVar61 = lVar61 + 1) {
      if (iVar1 <= iVar2) {
        lVar71 = 0;
        do {
          dVar90 = pdVar63[lVar71];
          dVar89 = pdVar75[lVar71];
          if (l_use_forces_in_trans) {
            dVar90 = dVar90 + pdVar68[lVar71] * dVar88;
            dVar89 = dVar89 + pdVar60[lVar71] * dVar88;
          }
          if (iVar3 < lVar61) {
            if (iVar6 < lVar61) {
              switch(pbc[1].bc[4]) {
              case 1:
              case 2:
              case 4:
                dVar89 = dVar90;
                break;
              case 3:
                dVar89 = local_2a8[lVar71];
                goto switchD_0037fd48_caseD_1;
              case -1:
                goto switchD_0037fd2b_caseD_ffffffff;
              }
            }
          }
          else {
            switch(pbc[1].bc[1]) {
            case 3:
              dVar89 = pdVar74[lVar71];
            case 1:
            case 2:
            case 4:
switchD_0037fd48_caseD_1:
              dVar90 = dVar89;
              break;
            case -1:
switchD_0037fd2b_caseD_ffffffff:
              dVar89 = 0.0;
              dVar90 = 0.0;
            }
          }
          if (((dVar90 <= 0.0) && (0.0 <= dVar89)) || (ABS(dVar89 + dVar90) < 1e-08)) {
            dVar90 = 0.0;
          }
          else {
            uVar87 = -(ulong)(0.0 <= dVar89 + dVar90);
            dVar90 = (double)(~uVar87 & (ulong)dVar89 | (ulong)dVar90 & uVar87);
          }
          pdVar80[lVar71] = dVar90;
          lVar71 = lVar71 + 1;
        } while ((iVar2 - iVar1) + 1 != (int)lVar71);
      }
      pdVar63 = pdVar63 + lVar34;
      pdVar60 = pdVar60 + lVar33;
      pdVar68 = pdVar68 + lVar33;
      pdVar75 = pdVar75 + lVar37;
      pdVar80 = pdVar80 + lVar45;
    }
    lVar81 = lVar81 + 1;
    pdVar65 = pdVar65 + lVar32;
    pdVar67 = pdVar67 + lVar32;
    local_2a8 = local_2a8 + lVar43;
    pdVar74 = pdVar74 + lVar43;
    pdVar72 = pdVar72 + lVar46;
    pdVar70 = pdVar70 + lVar38;
    pdVar62 = pdVar62 + lVar35;
  } while( true );
}

Assistant:

void
Godunov::ComputeAdvectiveVel ( Box const& xbx,
                               Box const& ybx,
                               Box const& zbx,
                               Array4<Real> const& u_ad,
                               Array4<Real> const& v_ad,
                               Array4<Real> const& w_ad,
                               Array4<Real const> const& Imx,
                               Array4<Real const> const& Imy,
                               Array4<Real const> const& Imz,
                               Array4<Real const> const& Ipx,
                               Array4<Real const> const& Ipy,
                               Array4<Real const> const& Ipz,
                               Array4<Real const> const& vel,
                               Array4<Real const> const& f,
                               const Box& domain,
                               Real l_dt,
                               BCRec  const* pbc,
                               bool l_use_forces_in_trans)
{
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    amrex::ParallelFor(AMREX_D_DECL(xbx, ybx, zbx),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about x-velocity on x-faces here
        constexpr int n = 0;

        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, vel, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        u_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about y-velocity on y-faces here
        constexpr int n = 1;

        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, vel, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        v_ad(i,j,k) = ltm ? 0. : st;
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // We only care about z-velocity on z-faces here
        constexpr int n = 2;

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        auto bc = pbc[n];
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, vel, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = ( (lo+hi) >= 0.) ? lo : hi;
        bool ltm = ( (lo <= 0. && hi >= 0.) || (amrex::Math::abs(lo+hi) < small_vel) );
        w_ad(i,j,k) = ltm ? 0. : st;
    }
    );
}